

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigPrintClass(Ivy_Obj_t *pClass)

{
  printf("Class {");
  if (pClass != (Ivy_Obj_t *)0x0) {
    do {
      printf(" %d(%d)%c",(ulong)(uint)pClass->Id,(ulong)(*(uint *)&pClass->field_0x8 >> 0xb),
             (ulong)((uint)(-1 < (char)*(uint *)&pClass->field_0x8) * 2 + 0x2b));
      pClass = pClass->pNextFan1;
    } while (pClass != (Ivy_Obj_t *)0x0);
  }
  puts(" }");
  return;
}

Assistant:

void Ivy_FraigPrintClass( Ivy_Obj_t * pClass )
{
    Ivy_Obj_t * pObj;
    printf( "Class {" );
    Ivy_FraigForEachClassNode( pClass, pObj )
        printf( " %d(%d)%c", pObj->Id, pObj->Level, pObj->fPhase? '+' : '-' );
    printf( " }\n" );
}